

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<float,float,float,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalMultiplyOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  ValidityMask *pVVar1;
  ValidityMask *ldata_00;
  SelectionVector *in_RCX;
  byte in_R8B;
  float *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffed8;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffee0;
  float *result_data_00;
  ValidityMask *lvalidity;
  ValidityMask *in_stack_ffffffffffffff28;
  ValidityMask *in_stack_ffffffffffffff30;
  SelectionVector *local_c8;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  float local_70 [15];
  byte local_31;
  SelectionVector *local_30;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::SetVectorType(in_stack_fffffffffffffee0,vector_type_p);
  pVVar1 = (ValidityMask *)FlatVector::GetData<float>((Vector *)0x12f35bd);
  UnifiedVectorFormat::GetData<float>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<float>((UnifiedVectorFormat *)&local_c8);
  result_data_00 = local_70;
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff48;
  lvalidity = pVVar1;
  ldata_00 = FlatVector::Validity((Vector *)0x12f364a);
  ExecuteGenericLoop<float,float,float,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalMultiplyOverflowCheck,bool>
            ((float *)ldata_00,(float *)this,result_data_00,local_30,local_c8,
             (idx_t)in_stack_ffffffffffffff80,lvalidity,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff30,SUB81((ulong)pVVar1 >> 0x38,0));
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}